

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinformation_p.h
# Opt level: O0

void __thiscall
QNetworkInformationBackend::setMetered(QNetworkInformationBackend *this,bool isMetered)

{
  long lVar1;
  byte bVar2;
  byte in_SIL;
  QReadWriteLock *in_RDI;
  long in_FS_OFFSET;
  QWriteLocker locker;
  undefined7 in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_SIL & 1;
  QWriteLocker::QWriteLocker
            ((QWriteLocker *)(CONCAT17(in_SIL,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff),in_RDI
            );
  if ((*(byte *)((long)&in_RDI[4].d_ptr.super_QBasicAtomicPointer<QReadWriteLockPrivate>._q_value.
                        _M_b._M_p + 1) & 1) != (bVar2 & 1)) {
    *(byte *)((long)&in_RDI[4].d_ptr.super_QBasicAtomicPointer<QReadWriteLockPrivate>._q_value._M_b.
                     _M_p + 1) = bVar2 & 1;
    QWriteLocker::unlock((QWriteLocker *)CONCAT17(bVar2,in_stack_ffffffffffffffe0));
    ::QNetworkInformationBackend::isMeteredChanged(SUB81(in_RDI,0));
  }
  QWriteLocker::~QWriteLocker((QWriteLocker *)0x1030b5);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void setMetered(bool isMetered)
    {
        QWriteLocker locker(&m_lock);
        if (m_metered != isMetered) {
            m_metered = isMetered;
            locker.unlock();
            emit isMeteredChanged(isMetered);
        }
    }